

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::JavascriptArray
          (JavascriptArray *this,uint32 length,uint32 size,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  undefined4 *puVar4;
  Recycler *recycler_00;
  SparseArraySegmentBase *segment;
  Recycler *recycler;
  DynamicType *type_local;
  uint32 size_local;
  uint32 length_local;
  JavascriptArray *this_local;
  
  ArrayObject::ArrayObject(&this->super_ArrayObject,type,false,length);
  (this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e019f8;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierPtr(&this->head);
  SegmentUnionType::SegmentUnionType((SegmentUnionType *)&(this->segmentUnion).lastUsedSegment);
  TVar3 = Js::Type::GetTypeId(&type->super_Type);
  if (TVar3 != TypeIds_Array) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x192,"(type->GetTypeId() == TypeIds_Array)",
                                "type->GetTypeId() == TypeIds_Array");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DynamicObject::InitArrayFlags((DynamicObject *)this,InitialArrayValue);
  recycler_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  segment = &SparseArraySegment<void_*>::AllocateSegment
                       (recycler_00,0,0,size,(SparseArraySegmentBase *)0x0)->
             super_SparseArraySegmentBase;
  SetHeadAndLastUsedSegment(this,segment);
  return;
}

Assistant:

JavascriptArray::JavascriptArray(uint32 length, uint32 size, DynamicType * type)
        : ArrayObject(type, false, length)
    {
        Assert(type->GetTypeId() == TypeIds_Array);
        InitArrayFlags(DynamicObjectFlags::InitialArrayValue);
        Recycler* recycler = GetRecycler();
        SetHeadAndLastUsedSegment(SparseArraySegment<Var>::AllocateSegment(recycler, 0, 0, size, nullptr));
    }